

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O3

void __thiscall PointBlock<3U>::PointBlock(PointBlock<3U> *this,Bounds *bounds_)

{
  allocator<float> local_12;
  allocator<float> local_11;
  
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            ((small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)this,
             (small_vector<float,_4UL,_0UL,_std::allocator<float>_> *)bounds_,&local_12);
  itlib::small_vector<float,_4UL,_0UL,_std::allocator<float>_>::small_vector
            (&(this->bounds).max.super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,
             &(bounds_->max).super_small_vector<float,_4UL,_0UL,_std::allocator<float>_>,&local_11);
  diy::Bounds<float>::Bounds(&this->box,3);
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

PointBlock(const Bounds& bounds_):
        bounds(bounds_)                         {}